

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

int __thiscall jrtplib::RTPExternalTransmitter::AbortWait(RTPExternalTransmitter *this)

{
  RTPExternalTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x97;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x96;
  }
  else if ((this->waitingfordata & 1U) == 0) {
    this_local._4_4_ = -0x98;
  }
  else {
    RTPAbortDescriptors::SendAbortSignal(&this->m_abortDesc);
    this->m_abortCount = this->m_abortCount + 1;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPExternalTransmitter::AbortWait()
{
	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTCREATED;
	}
	if (!waitingfordata)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTWAITING;
	}

	m_abortDesc.SendAbortSignal();
	m_abortCount++;
	
	MAINMUTEX_UNLOCK
	return 0;
}